

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLongStressTestUtil.cpp
# Opt level: O3

ProgramContext * __thiscall
deqp::gls::LongStressTestUtil::ProgramLibrary::generateBufferContext
          (ProgramContext *__return_storage_ptr__,ProgramLibrary *this,int numDummyAttributes)

{
  vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_> *this_00;
  char *pcVar1;
  undefined8 vtxShaderSource_;
  long *plVar2;
  undefined8 *puVar3;
  mapped_type *pmVar4;
  ProgramLibrary *pPVar5;
  size_type *psVar6;
  long *plVar7;
  ulong *puVar8;
  ulong uVar9;
  int iVar10;
  string vtxColorExpr;
  ProgramContext *context;
  string vtxDummyInputs;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  firstLevelParams;
  key_type local_370;
  int local_34c;
  string local_348;
  Vector<float,_4> local_328;
  ulong local_318;
  long lStack_310;
  ProgramContext *local_300;
  long *local_2f8;
  long local_2f0;
  long local_2e8;
  long lStack_2e0;
  ulong *local_2d8;
  long local_2d0;
  ulong local_2c8 [2];
  undefined1 *local_2b8;
  undefined8 local_2b0;
  undefined1 local_2a8;
  undefined7 uStack_2a7;
  undefined8 local_298;
  float fStack_290;
  float fStack_28c;
  VarSpec local_280;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1d8;
  undefined1 local_1a8 [376];
  
  local_1d8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_1d8._M_impl.super__Rb_tree_header._M_header;
  local_1d8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  iVar10 = 0;
  local_1d8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_1d8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_280.name._M_dataplus._M_p = (pointer)&local_280.name.field_2;
  local_280.name._M_string_length = 0;
  local_280.name.field_2._M_local_buf[0] = '\0';
  local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
  local_348._M_string_length = 0;
  local_348.field_2._M_allocated_capacity =
       local_348.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_34c = numDummyAttributes;
  local_300 = __return_storage_ptr__;
  local_298 = this;
  local_1d8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_1d8._M_impl.super__Rb_tree_header._M_header._M_left;
  if (0 < numDummyAttributes) {
    do {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::ostream::operator<<((ostringstream *)local_1a8,iVar10);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
      plVar2 = (long *)std::__cxx11::string::replace((ulong)&local_2f8,0,(char *)0x0,0xb56922);
      pPVar5 = (ProgramLibrary *)(plVar2 + 2);
      if ((ProgramLibrary *)*plVar2 == pPVar5) {
        local_318 = *(ulong *)pPVar5;
        lStack_310 = plVar2[3];
        local_328.m_data._0_8_ = (ProgramLibrary *)&local_318;
      }
      else {
        local_318 = *(ulong *)pPVar5;
        local_328.m_data._0_8_ = (ProgramLibrary *)*plVar2;
      }
      local_328.m_data._8_8_ = plVar2[1];
      *plVar2 = (long)pPVar5;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      plVar2 = (long *)std::__cxx11::string::append((char *)&local_328);
      local_370._M_dataplus._M_p = (pointer)&local_370.field_2;
      psVar6 = (size_type *)(plVar2 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar2 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar6) {
        local_370.field_2._M_allocated_capacity = *psVar6;
        local_370.field_2._8_8_ = plVar2[3];
      }
      else {
        local_370.field_2._M_allocated_capacity = *psVar6;
        local_370._M_dataplus._M_p = (pointer)*plVar2;
      }
      local_370._M_string_length = plVar2[1];
      *plVar2 = (long)psVar6;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      std::__cxx11::string::_M_append((char *)&local_280,(ulong)local_370._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_370._M_dataplus._M_p != &local_370.field_2) {
        operator_delete(local_370._M_dataplus._M_p,local_370.field_2._M_allocated_capacity + 1);
      }
      if ((ProgramLibrary *)local_328.m_data._0_8_ != (ProgramLibrary *)&local_318) {
        operator_delete((void *)local_328.m_data._0_8_,local_318 + 1);
      }
      if (local_2f8 != &local_2e8) {
        operator_delete(local_2f8,local_2e8 + 1);
      }
      local_2b8 = &local_2a8;
      local_2b0 = 0;
      local_2a8 = 0;
      plVar2 = (long *)std::__cxx11::string::append((char *)&local_2b8);
      plVar7 = plVar2 + 2;
      if ((long *)*plVar2 == plVar7) {
        local_2e8 = *plVar7;
        lStack_2e0 = plVar2[3];
        local_2f8 = &local_2e8;
      }
      else {
        local_2e8 = *plVar7;
        local_2f8 = (long *)*plVar2;
      }
      local_2f0 = plVar2[1];
      *plVar2 = (long)plVar7;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      plVar2 = (long *)std::__cxx11::string::append((char *)&local_2f8);
      pPVar5 = (ProgramLibrary *)(plVar2 + 2);
      if ((ProgramLibrary *)*plVar2 == pPVar5) {
        local_318 = *(ulong *)pPVar5;
        lStack_310 = plVar2[3];
        local_328.m_data._0_8_ = (ProgramLibrary *)&local_318;
      }
      else {
        local_318 = *(ulong *)pPVar5;
        local_328.m_data._0_8_ = (ProgramLibrary *)*plVar2;
      }
      local_328.m_data._8_8_ = plVar2[1];
      *plVar2 = (long)pPVar5;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::ostream::operator<<((ostringstream *)local_1a8,iVar10);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
      uVar9 = 0xf;
      if ((ProgramLibrary *)local_328.m_data._0_8_ != (ProgramLibrary *)&local_318) {
        uVar9 = local_318;
      }
      if (uVar9 < (ulong)(local_2d0 + local_328.m_data._8_8_)) {
        uVar9 = 0xf;
        if (local_2d8 != local_2c8) {
          uVar9 = local_2c8[0];
        }
        if (uVar9 < (ulong)(local_2d0 + local_328.m_data._8_8_)) goto LAB_008f3020;
        puVar3 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)&local_2d8,0,(char *)0x0,local_328.m_data._0_8_);
      }
      else {
LAB_008f3020:
        puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_328,(ulong)local_2d8);
      }
      local_370._M_dataplus._M_p = (pointer)&local_370.field_2;
      psVar6 = puVar3 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar3 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar6) {
        local_370.field_2._M_allocated_capacity = *psVar6;
        local_370.field_2._8_8_ = puVar3[3];
      }
      else {
        local_370.field_2._M_allocated_capacity = *psVar6;
        local_370._M_dataplus._M_p = (pointer)*puVar3;
      }
      local_370._M_string_length = puVar3[1];
      *puVar3 = psVar6;
      puVar3[1] = 0;
      *(undefined1 *)psVar6 = 0;
      std::__cxx11::string::_M_append((char *)&local_348,(ulong)local_370._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_370._M_dataplus._M_p != &local_370.field_2) {
        operator_delete(local_370._M_dataplus._M_p,local_370.field_2._M_allocated_capacity + 1);
      }
      if (local_2d8 != local_2c8) {
        operator_delete(local_2d8,local_2c8[0] + 1);
      }
      if ((ProgramLibrary *)local_328.m_data._0_8_ != (ProgramLibrary *)&local_318) {
        operator_delete((void *)local_328.m_data._0_8_,local_318 + 1);
      }
      if (local_2f8 != &local_2e8) {
        operator_delete(local_2f8,local_2e8 + 1);
      }
      if (local_2b8 != &local_2a8) {
        operator_delete(local_2b8,CONCAT71(uStack_2a7,local_2a8) + 1);
      }
      iVar10 = iVar10 + 1;
    } while (local_34c != iVar10);
  }
  pPVar5 = local_298;
  substitute((string *)local_1a8,local_298,&local_280.name);
  local_370._M_dataplus._M_p = (pointer)&local_370.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_370,"VTX_DUMMY_INPUTS","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_1d8,&local_370);
  std::__cxx11::string::operator=((string *)pmVar4,(string *)local_1a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_370._M_dataplus._M_p != &local_370.field_2) {
    operator_delete(local_370._M_dataplus._M_p,local_370.field_2._M_allocated_capacity + 1);
  }
  pcVar1 = local_1a8 + 0x10;
  if ((char *)local_1a8._0_8_ != pcVar1) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  local_1a8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"VTX_COLOR_EXPRESSION","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_1d8,(key_type *)local_1a8);
  std::__cxx11::string::_M_assign((string *)pmVar4);
  if ((char *)local_1a8._0_8_ != pcVar1) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_348._M_dataplus._M_p != &local_348.field_2) {
    operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280.name._M_dataplus._M_p != &local_280.name.field_2) {
    operator_delete(local_280.name._M_dataplus._M_p,
                    CONCAT71(local_280.name.field_2._M_allocated_capacity._1_7_,
                             local_280.name.field_2._M_local_buf[0]) + 1);
  }
  local_280.name._M_dataplus._M_p = (pointer)&local_280.name.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_280,
             "${VTX_HEADER}${VTX_IN} highp vec3 a_position;\n${VTX_DUMMY_INPUTS}${VTX_OUT} mediump vec4 v_color;\n\nvoid main (void)\n{\n\tgl_Position = vec4(a_position, 1.0);\n\tv_color = ${VTX_COLOR_EXPRESSION};\n}\n"
             ,"");
  substitute((string *)local_1a8,pPVar5,&local_280.name,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_1d8);
  vtxShaderSource_ = local_1a8._0_8_;
  local_370._M_dataplus._M_p = (pointer)&local_370.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_370,
             "${FRAG_HEADER}${FRAG_IN} mediump vec4 v_color;\n\nvoid main (void)\n{\n\t${FRAG_COLOR} = v_color;\n}\n"
             ,"");
  substitute(&local_348,pPVar5,&local_370);
  ProgramContext::ProgramContext
            (local_300,(char *)vtxShaderSource_,local_348._M_dataplus._M_p,"a_position");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_348._M_dataplus._M_p != &local_348.field_2) {
    operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_370._M_dataplus._M_p != &local_370.field_2) {
    operator_delete(local_370._M_dataplus._M_p,local_370.field_2._M_allocated_capacity + 1);
  }
  if ((char *)local_1a8._0_8_ != pcVar1) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280.name._M_dataplus._M_p != &local_280.name.field_2) {
    operator_delete(local_280.name._M_dataplus._M_p,
                    CONCAT71(local_280.name.field_2._M_allocated_capacity._1_7_,
                             local_280.name.field_2._M_local_buf[0]) + 1);
  }
  local_280.name._M_dataplus._M_p = (pointer)&local_280.name.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_280,"a_position","");
  local_348._M_dataplus._M_p = (pointer)0xbdcccccdbdcccccd;
  local_348._M_string_length = CONCAT44(local_348._M_string_length._4_4_,0xbdcccccd);
  local_370._M_dataplus._M_p = (pointer)0x3dcccccd3dcccccd;
  local_370._M_string_length = CONCAT44(local_370._M_string_length._4_4_,0x3dcccccd);
  VarSpec::VarSpec<tcu::Vector<float,3>>
            ((VarSpec *)local_1a8,&local_280.name,(Vector<float,_3> *)&local_348,
             (Vector<float,_3> *)&local_370);
  this_00 = &local_300->attributes;
  std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::
  emplace_back<deqp::gls::VarSpec>(this_00,(VarSpec *)local_1a8);
  if ((char *)local_1a8._0_8_ != pcVar1) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280.name._M_dataplus._M_p != &local_280.name.field_2) {
    operator_delete(local_280.name._M_dataplus._M_p,
                    CONCAT71(local_280.name.field_2._M_allocated_capacity._1_7_,
                             local_280.name.field_2._M_local_buf[0]) + 1);
  }
  if (0 < local_34c) {
    fStack_290 = 1.0 / (float)local_34c;
    local_298 = (ProgramLibrary *)CONCAT44(fStack_290,fStack_290);
    iVar10 = 0;
    fStack_28c = fStack_290;
    do {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::ostream::operator<<((ostringstream *)local_1a8,iVar10);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
      plVar2 = (long *)std::__cxx11::string::replace((ulong)&local_370,0,(char *)0x0,0xb56939);
      local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
      puVar8 = (ulong *)(plVar2 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar2 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar8) {
        local_348.field_2._M_allocated_capacity = *puVar8;
        local_348.field_2._8_8_ = plVar2[3];
      }
      else {
        local_348.field_2._M_allocated_capacity = *puVar8;
        local_348._M_dataplus._M_p = (pointer)*plVar2;
      }
      local_348._M_string_length = plVar2[1];
      *plVar2 = (long)puVar8;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      local_1a8._0_8_ = (char *)0x0;
      local_1a8._8_8_ = 0;
      local_328.m_data._8_8_ = CONCAT44(fStack_28c,fStack_290);
      local_328.m_data._0_8_ = local_298;
      VarSpec::VarSpec<tcu::Vector<float,4>>
                (&local_280,&local_348,(Vector<float,_4> *)local_1a8,&local_328);
      std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::
      emplace_back<deqp::gls::VarSpec>(this_00,&local_280);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_280.name._M_dataplus._M_p != &local_280.name.field_2) {
        operator_delete(local_280.name._M_dataplus._M_p,
                        CONCAT71(local_280.name.field_2._M_allocated_capacity._1_7_,
                                 local_280.name.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_348._M_dataplus._M_p != &local_348.field_2) {
        operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_370._M_dataplus._M_p != &local_370.field_2) {
        operator_delete(local_370._M_dataplus._M_p,local_370.field_2._M_allocated_capacity + 1);
      }
      iVar10 = iVar10 + 1;
    } while (local_34c != iVar10);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_1d8);
  return local_300;
}

Assistant:

gls::ProgramContext ProgramLibrary::generateBufferContext (const int numDummyAttributes) const
{
	static const char* const vertexTemplate =
		"${VTX_HEADER}"
		"${VTX_IN} highp vec3 a_position;\n"
		"${VTX_DUMMY_INPUTS}"
		"${VTX_OUT} mediump vec4 v_color;\n"
		"\n"
		"void main (void)\n"
		"{\n"
		"	gl_Position = vec4(a_position, 1.0);\n"
		"	v_color = ${VTX_COLOR_EXPRESSION};\n"
		"}\n";

	static const char* const fragmentTemplate =
		"${FRAG_HEADER}"
		"${FRAG_IN} mediump vec4 v_color;\n"
		"\n"
		"void main (void)\n"
		"{\n"
		"	${FRAG_COLOR} = v_color;\n"
		"}\n";

	map<string, string> firstLevelParams;

	{
		string vtxDummyInputs;
		string vtxColorExpr;
		for (int i = 0; i < numDummyAttributes; i++)
		{
			vtxDummyInputs	+= "${VTX_IN} mediump vec4 a_in" + toString(i) + ";\n";
			vtxColorExpr	+= string() + (i > 0 ? " + " : "") + "a_in" + toString(i);
		}

		firstLevelParams["VTX_DUMMY_INPUTS"]		= substitute(vtxDummyInputs);
		firstLevelParams["VTX_COLOR_EXPRESSION"]	= vtxColorExpr;
	}

	gls::ProgramContext context(substitute(vertexTemplate, firstLevelParams).c_str(), substitute(fragmentTemplate).c_str(), "a_position");

	context.attributes.push_back(gls::VarSpec("a_position", Vec3(-0.1f), Vec3(0.1f)));

	for (int i = 0; i < numDummyAttributes; i++)
		context.attributes.push_back(gls::VarSpec("a_in" + de::toString(i), Vec4(0.0f), Vec4(1.0f / (float)numDummyAttributes)));

	return context;
}